

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)403>(Result *__return_storage_ptr__,Model *format)

{
  Rep *pRVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  NeuralNetworkClassifier *pNVar6;
  iterator iVar7;
  long lVar8;
  undefined1 in_R9B;
  void **ppvVar9;
  ModelDescription *pMVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string err;
  string probBlob;
  Result r;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputBlobNames;
  
  pNVar6 = Specification::Model::neuralnetworkclassifier(format);
  validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::NeuralNetworkClassifier>
            (&r,(CoreML *)format,(Model *)pNVar6,(NeuralNetworkClassifier *)0x0,false,(bool)in_R9B);
  bVar3 = Result::good(&r);
  if (bVar3) {
    outputBlobNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &outputBlobNames._M_t._M_impl.super__Rb_tree_header._M_header;
    outputBlobNames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    outputBlobNames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    outputBlobNames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pMVar10 = format->description_;
    outputBlobNames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         outputBlobNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pNVar6 = Specification::Model::neuralnetworkclassifier(format);
    if (pMVar10 == (ModelDescription *)0x0) {
      pMVar10 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
    }
    validateNeuralNetworkTopLevel<CoreML::Specification::NeuralNetworkClassifier>
              ((Result *)&probBlob,pMVar10,pNVar6,&outputBlobNames,format->isupdatable_);
    Result::operator=(&r,(Result *)&probBlob);
    std::__cxx11::string::~string((string *)&probBlob._M_string_length);
    bVar3 = Result::good(&r);
    if (bVar3) {
      pNVar6 = Specification::Model::neuralnetworkclassifier(format);
      std::__cxx11::string::string
                ((string *)&probBlob,(string *)(pNVar6->labelprobabilitylayername_).ptr_);
      iVar4 = std::__cxx11::string::compare((char *)&probBlob);
      if ((iVar4 == 0) ||
         (iVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&outputBlobNames._M_t,&probBlob),
         (_Rb_tree_header *)iVar7._M_node != &outputBlobNames._M_t._M_impl.super__Rb_tree_header)) {
        pMVar10 = format->description_;
        if (pMVar10 == (ModelDescription *)0x0) {
          pMVar10 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
        }
        pRVar1 = (pMVar10->output_).super_RepeatedPtrFieldBase.rep_;
        ppvVar9 = pRVar1->elements;
        if (pRVar1 == (Rep *)0x0) {
          ppvVar9 = (void **)0x0;
        }
        iVar4 = (pMVar10->output_).super_RepeatedPtrFieldBase.current_size_;
        for (lVar8 = 0; (long)iVar4 * 8 != lVar8; lVar8 = lVar8 + 8) {
          lVar2 = *(long *)((long)ppvVar9 + lVar8);
          iVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&outputBlobNames._M_t,*(key_type **)(lVar2 + 0x10));
          if ((((_Rb_tree_header *)iVar7._M_node ==
                &outputBlobNames._M_t._M_impl.super__Rb_tree_header) &&
              (iVar5 = std::__cxx11::string::compare(*(string **)(lVar2 + 0x10)), iVar5 != 0)) &&
             (iVar5 = std::__cxx11::string::compare(*(string **)(lVar2 + 0x10)), iVar5 != 0)) {
            std::operator+(&local_f0,"Output layer \'",
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (lVar2 + 0x10));
            std::operator+(&err,&local_f0,"\' is not produced by any layer of the neural network.");
            std::__cxx11::string::~string((string *)&local_f0);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
            goto LAB_0055e973;
          }
        }
        Result::Result(__return_storage_ptr__,&r);
      }
      else {
        std::operator+(&local_f0,
                       "For this neural network classifier, the probabilities are obtained from the layer \'"
                       ,&probBlob);
        std::operator+(&err,&local_f0,"\' which was not found in the network.");
        std::__cxx11::string::~string((string *)&local_f0);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
LAB_0055e973:
        std::__cxx11::string::~string((string *)&err);
      }
      std::__cxx11::string::~string((string *)&probBlob);
    }
    else {
      Result::Result(__return_storage_ptr__,&r);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&outputBlobNames._M_t);
  }
  else {
    Result::Result(__return_storage_ptr__,&r);
  }
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_neuralNetworkClassifier>(const Specification::Model& format) {
        // must have classifier parameters
        Result r = validateClassifierInterface(format, format.neuralnetworkclassifier());
        if (!r.good()) {
            return r;
        }
        
        std::set<std::string> outputBlobNames;
        r = validateNeuralNetworkTopLevel(format.description(), format.neuralnetworkclassifier(), outputBlobNames, format.isupdatable());
        
        if (!r.good()) {
            return r;
        }
        
        std::string probBlob = format.neuralnetworkclassifier().labelprobabilitylayername();
        // Check if the probability blob name was provided in the proto
        if (probBlob.compare("") != 0) {
            // Check if it corresponds to some output of the network
            if (outputBlobNames.find(probBlob) == outputBlobNames.end()) {
                std::string err = "For this neural network classifier, the probabilities are obtained from the layer '" + probBlob + "' which was not found in the network.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
        
        // Now, we need to check that all the model's output names are either blob names or the extra outputs
        // for a classifier
        for (const auto& output : format.description().output()) {
            // is it not an output blob?
            if (outputBlobNames.find(output.name()) == outputBlobNames.end()) {
                if (output.name().compare(format.description().predictedfeaturename()) != 0
                    && output.name().compare(format.description().predictedprobabilitiesname()) != 0) {
                    std::string err = "Output layer '" + output.name() + "' is not produced by any layer of the neural network.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
        
        return r;
        
    }